

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O2

int json_object_put(json_object *jso)

{
  json_type jVar1;
  long lVar2;
  int iVar3;
  uint32_t uVar4;
  
  iVar3 = 0;
  if (jso != (json_object *)0x0) {
    if (jso->_ref_count == 0) {
      __assert_fail("jso->_ref_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/json_object.c"
                    ,0x118,"int json_object_put(struct json_object *)");
    }
    uVar4 = jso->_ref_count - 1;
    jso->_ref_count = uVar4;
    if (uVar4 == 0) {
      if (jso->_user_delete != (json_object_delete_fn *)0x0) {
        (*jso->_user_delete)(jso,jso->_userdata);
      }
      jVar1 = jso->o_type;
      if (jVar1 == json_type_string) {
        lVar2._0_4_ = jso[1].o_type;
        lVar2._4_4_ = jso[1]._ref_count;
        if (lVar2 < 0) {
          free(jso[1]._to_json_string);
        }
      }
      else if (jVar1 == json_type_array) {
        array_list_free(*(array_list **)(jso + 1));
      }
      else if (jVar1 == json_type_object) {
        lh_table_free(*(lh_table **)(jso + 1));
      }
      json_object_generic_delete(jso);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int json_object_put(struct json_object *jso)
{
	if (!jso)
		return 0;

	/* Avoid invalid free and crash explicitly instead of (silently)
	 * segfaulting.
	 */
	assert(jso->_ref_count > 0);

#if defined(HAVE_ATOMIC_BUILTINS) && defined(ENABLE_THREADING)
	/* Note: this only allow the refcount to remain correct
	 * when multiple threads are adjusting it.  It is still an error
	 * for a thread to decrement the refcount if it doesn't "own" it,
	 * as that can result in the thread that loses the race to 0
	 * operating on an already-freed object.
	 */
	if (__sync_sub_and_fetch(&jso->_ref_count, 1) > 0)
		return 0;
#else
	if (--jso->_ref_count > 0)
		return 0;
#endif

	if (jso->_user_delete)
		jso->_user_delete(jso, jso->_userdata);
	switch (jso->o_type)
	{
	case json_type_object: json_object_object_delete(jso); break;
	case json_type_array: json_object_array_delete(jso); break;
	case json_type_string: json_object_string_delete(jso); break;
	default: json_object_generic_delete(jso); break;
	}
	return 1;
}